

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::write_str<wchar_t>
          (BasicWriter<wchar_t> *this,wchar_t *s,size_t size,AlignSpec *spec)

{
  wchar_t fill_00;
  undefined8 in_RAX;
  CharPtr buffer;
  ulong n;
  wchar_t fill;
  undefined8 uStack_28;
  
  n = (ulong)(spec->super_WidthSpec).width_;
  uStack_28 = in_RAX;
  if (size < n) {
    buffer = grow_buffer(this,n);
    fill_00 = (spec->super_WidthSpec).fill_;
    uStack_28 = CONCAT44(fill_00,(undefined4)uStack_28);
    if (spec->align_ == ALIGN_CENTER) {
      buffer = fill_padding(buffer,(spec->super_WidthSpec).width_,size,fill_00);
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>
                (buffer,(spec->super_WidthSpec).width_ - size,(long)&uStack_28 + 4);
      buffer = buffer + ((spec->super_WidthSpec).width_ - size);
    }
    else {
      std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>
                (buffer + size,(spec->super_WidthSpec).width_ - size,(long)&uStack_28 + 4);
    }
  }
  else {
    buffer = grow_buffer(this,size);
  }
  if (size != 0) {
    memmove(buffer,s,size << 2);
  }
  return buffer;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::uninitialized_fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::uninitialized_fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::uninitialized_copy(s, s + size, out);
  return out;
}